

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 local_b0;
  float local_a8;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_6c;
  float local_68;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if ((x_end_norm == x_start_norm) && (!NAN(x_end_norm) && !NAN(x_start_norm))) {
    return;
  }
  fVar7 = x_end_norm;
  if (x_start_norm <= x_end_norm) {
    fVar7 = x_start_norm;
    x_start_norm = x_end_norm;
  }
  fVar8 = (rect->Min).x;
  local_98 = (rect->Min).y;
  fVar15 = (rect->Max).x - fVar8;
  local_68 = fVar7 * fVar15 + fVar8;
  fVar14 = x_start_norm * fVar15 + fVar8;
  fVar7 = (rect->Max).y;
  fVar9 = 0.0;
  local_58.x = fVar14;
  local_58.y = fVar7;
  local_50.x = local_68;
  local_50.y = local_98;
  if ((rounding != 0.0) || (NAN(rounding))) {
    fVar13 = (fVar7 - local_98) * 0.5;
    fVar16 = fVar15 * 0.5;
    if (fVar13 <= fVar15 * 0.5) {
      fVar16 = fVar13;
    }
    fVar16 = fVar16 + -1.0;
    if (fVar16 <= rounding) {
      rounding = fVar16;
    }
    local_a8 = (float)(~-(uint)(fVar16 < 0.0) & (uint)rounding);
    local_88 = 1.0 / local_a8;
    fVar15 = 1.0 - (local_68 - fVar8) * local_88;
    if (fVar15 <= 0.0) {
      fVar9 = 1.5707964;
    }
    else if (fVar15 < 1.0) {
      fVar9 = acosf(fVar15);
      fVar8 = (rect->Min).x;
    }
    fVar15 = 1.0 - (fVar14 - fVar8) * local_88;
    fVar16 = 0.0;
    if (fVar15 <= 0.0) {
      fVar16 = 1.5707964;
    }
    else if (fVar15 < 1.0) {
      fVar16 = acosf(fVar15);
      fVar8 = (rect->Min).x;
    }
    uVar6 = -(uint)(fVar8 + local_a8 <= local_68);
    local_48 = (float)(uVar6 & (uint)local_68 | ~uVar6 & (uint)(fVar8 + local_a8));
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    if ((fVar9 != fVar16) || (NAN(fVar9) || NAN(fVar16))) {
      local_b0.y = fVar7 - local_a8;
      local_b0.x = local_48;
      if ((fVar9 != 0.0) || (((NAN(fVar9) || (fVar16 != 1.5707964)) || (NAN(fVar16))))) {
        local_6c = fVar16;
        ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,3.1415927 - fVar16,3.1415927 - fVar9,0);
        local_b0.y = local_98 + local_a8;
        local_b0.x = local_48;
        ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,fVar9 + 3.1415927,local_6c + 3.1415927,0)
        ;
      }
      else {
        ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,3,6);
        local_b0.y = local_98 + local_a8;
        local_b0.x = local_48;
        ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,6,9);
      }
    }
    else {
      iVar4 = (draw_list->_Path).Size;
      if (iVar4 == (draw_list->_Path).Capacity) {
        if (iVar4 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar4 / 2 + iVar4;
        }
        iVar5 = iVar4 + 1;
        if (iVar4 + 1 < iVar3) {
          iVar5 = iVar3;
        }
        pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
        pIVar1 = (draw_list->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
          MemFree((draw_list->_Path).Data);
        }
        (draw_list->_Path).Data = pIVar2;
        (draw_list->_Path).Capacity = iVar5;
        iVar4 = (draw_list->_Path).Size;
      }
      else {
        pIVar2 = (draw_list->_Path).Data;
      }
      pIVar2[iVar4].x = local_48;
      pIVar2[iVar4].y = fVar7;
      iVar3 = (draw_list->_Path).Size;
      iVar4 = iVar3 + 1;
      (draw_list->_Path).Size = iVar4;
      if (iVar4 == (draw_list->_Path).Capacity) {
        iVar3 = iVar3 + 2;
        if (iVar4 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar4 / 2 + iVar4;
        }
        if (iVar3 < iVar4) {
          iVar3 = iVar4;
        }
        pIVar2 = (ImVec2 *)MemAlloc((long)iVar3 << 3);
        pIVar1 = (draw_list->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
          MemFree((draw_list->_Path).Data);
        }
        (draw_list->_Path).Data = pIVar2;
        (draw_list->_Path).Capacity = iVar3;
        iVar4 = (draw_list->_Path).Size;
      }
      else {
        pIVar2 = (draw_list->_Path).Data;
      }
      pIVar2[iVar4].x = local_48;
      pIVar2[iVar4].y = local_98;
      (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    }
    if ((rect->Min).x + local_a8 < fVar14) {
      fVar8 = (rect->Max).x;
      fVar9 = 1.0 - (fVar8 - fVar14) * local_88;
      if (fVar9 <= 0.0) {
        fVar15 = 1.5707964;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
      }
      else {
        fVar15 = 0.0;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        if (fVar9 < 1.0) {
          fVar15 = acosf(fVar9);
          fVar8 = (rect->Max).x;
          uVar17 = extraout_XMM0_Db;
          uVar18 = extraout_XMM0_Dc;
          uVar19 = extraout_XMM0_Dd;
        }
      }
      uVar12 = 0;
      uVar11 = 0;
      uVar10 = 0;
      fVar9 = 1.5707964;
      fVar16 = 1.0 - (fVar8 - local_68) * local_88;
      if (0.0 < fVar16) {
        fVar9 = 0.0;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        if (fVar16 < 1.0) {
          local_88 = fVar15;
          uStack_84 = uVar17;
          uStack_80 = uVar18;
          uStack_7c = uVar19;
          fVar9 = acosf(fVar16);
          fVar8 = (rect->Max).x;
          uVar10 = extraout_XMM0_Db_00;
          uVar11 = extraout_XMM0_Dc_00;
          uVar12 = extraout_XMM0_Dd_00;
          fVar15 = local_88;
          uVar17 = uStack_84;
          uVar18 = uStack_80;
          uVar19 = uStack_7c;
        }
      }
      if (fVar8 - local_a8 <= fVar14) {
        fVar14 = fVar8 - local_a8;
      }
      if ((fVar15 != fVar9) || (NAN(fVar15) || NAN(fVar9))) {
        local_b0.y = local_98 + local_a8;
        local_b0.x = fVar14;
        if (((fVar15 != 0.0) || ((NAN(fVar15) || (fVar9 != 1.5707964)))) || (NAN(fVar9))) {
          local_98 = fVar9;
          uStack_94 = uVar10;
          uStack_90 = uVar11;
          uStack_8c = uVar12;
          local_88 = fVar15;
          uStack_84 = uVar17;
          uStack_80 = uVar18;
          uStack_7c = uVar19;
          ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,-fVar9,-fVar15,0);
          local_b0.y = fVar7 - local_a8;
          local_b0.x = fVar14;
          ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,local_88,local_98,0);
        }
        else {
          ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,9,0xc);
          local_b0.y = fVar7 - local_a8;
          local_b0.x = fVar14;
          ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,0,3);
        }
      }
      else {
        iVar4 = (draw_list->_Path).Size;
        if (iVar4 == (draw_list->_Path).Capacity) {
          if (iVar4 == 0) {
            iVar3 = 8;
          }
          else {
            iVar3 = iVar4 / 2 + iVar4;
          }
          iVar5 = iVar4 + 1;
          if (iVar4 + 1 < iVar3) {
            iVar5 = iVar3;
          }
          pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
          pIVar1 = (draw_list->_Path).Data;
          if (pIVar1 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar2;
          (draw_list->_Path).Capacity = iVar5;
          iVar4 = (draw_list->_Path).Size;
        }
        else {
          pIVar2 = (draw_list->_Path).Data;
        }
        pIVar2[iVar4].x = fVar14;
        pIVar2[iVar4].y = local_98;
        iVar3 = (draw_list->_Path).Size;
        iVar4 = iVar3 + 1;
        (draw_list->_Path).Size = iVar4;
        if (iVar4 == (draw_list->_Path).Capacity) {
          iVar3 = iVar3 + 2;
          if (iVar4 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = iVar4 / 2 + iVar4;
          }
          if (iVar3 < iVar4) {
            iVar3 = iVar4;
          }
          pIVar2 = (ImVec2 *)MemAlloc((long)iVar3 << 3);
          pIVar1 = (draw_list->_Path).Data;
          if (pIVar1 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar2;
          (draw_list->_Path).Capacity = iVar3;
          iVar4 = (draw_list->_Path).Size;
        }
        else {
          pIVar2 = (draw_list->_Path).Data;
        }
        pIVar2[iVar4].x = fVar14;
        pIVar2[iVar4].y = fVar7;
        (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
      }
    }
    ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col);
    (draw_list->_Path).Size = 0;
  }
  else if (0xffffff < col) {
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_50,&local_58,col);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float half_pi = IM_PI * 0.5f; // We will == compare to this because we know this is the exact value ImAcos01 can return.
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == half_pi)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == half_pi)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e); // BR
        }
    }
    draw_list->PathFillConvex(col);
}